

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

MessageType __thiscall
cmMakefile::ExpandVariablesInStringNew
          (cmMakefile *this,string *errorstr,string *source,bool escapeQuotes,bool noEscapes,
          bool atOnly,char *filename,long line,bool removeEmpty,bool replaceAt)

{
  ulong *puVar1;
  t_domain tVar2;
  ulong uVar3;
  cmake *this_00;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  char *pcVar8;
  byte *pbVar9;
  size_t sVar10;
  undefined8 uVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  ostream *poVar13;
  long *plVar14;
  undefined7 in_register_00000009;
  ulong *puVar15;
  size_type *psVar16;
  byte *pbVar17;
  undefined7 in_register_00000081;
  undefined3 in_register_00000089;
  uint uVar18;
  byte *pbVar19;
  byte bVar20;
  string result;
  vector<t_lookup,_std::allocator<t_lookup>_> openstack;
  cmListFileContext lfc;
  string varresult;
  cmOutputConverter converter;
  ostringstream ostr;
  byte *local_330;
  allocator local_321;
  string *local_320;
  string local_318;
  cmMakefile *local_2f8;
  MessageType local_2f0;
  allocator local_2ea;
  allocator local_2e9;
  undefined1 *local_2e8;
  char *local_2e0;
  undefined1 local_2d8;
  undefined7 uStack_2d7;
  t_lookup *local_2c8;
  iterator iStack_2c0;
  t_lookup *local_2b8;
  undefined1 local_2b0 [32];
  _Alloc_hider local_290;
  size_type local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  long local_270;
  undefined4 local_264;
  undefined1 *local_260;
  char *pcStack_258;
  undefined1 local_250;
  undefined7 uStack_24f;
  long local_240;
  ulong local_238;
  string local_230;
  undefined4 local_210;
  undefined4 local_20c;
  Snapshot *local_208;
  string *local_200;
  string local_1f8;
  RegularExpression *local_1d8;
  cmState *local_1d0;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_210 = CONCAT31(in_register_00000089,atOnly);
  local_20c = (undefined4)CONCAT71(in_register_00000081,noEscapes);
  local_264 = (undefined4)CONCAT71(in_register_00000009,escapeQuotes);
  pbVar17 = (byte *)(source->_M_dataplus)._M_p;
  local_2e8 = &local_2d8;
  local_2e0 = (char *)0x0;
  local_2d8 = 0;
  local_320 = errorstr;
  local_200 = source;
  std::__cxx11::string::reserve((ulong)&local_2e8);
  local_240 = line;
  local_2c8 = (t_lookup *)0x0;
  iStack_2c0._M_current = (t_lookup *)0x0;
  local_2b8 = (t_lookup *)0x0;
  local_1d0 = this->GlobalGenerator->CMakeInstance->State;
  bVar20 = *pbVar17;
  puVar1 = (ulong *)(local_2b0 + 0x10);
  local_1d8 = &this->cmNamedCurly;
  local_208 = &this->StateSnapshot;
  local_2f0 = LOG;
  local_238 = 0;
  local_330 = pbVar17;
  local_2f8 = this;
  do {
    if (bVar20 < 0x40) {
      if (bVar20 == 10) {
        local_240 = local_240 + 1;
      }
      else {
        if (bVar20 != 0x24) {
          if (bVar20 != 0) goto LAB_00253104;
          if ((local_238 & 1) != 0) goto LAB_00253bc0;
          break;
        }
        if ((char)local_210 != '\0') goto LAB_00252f10;
        local_260 = (undefined1 *)((ulong)local_260 & 0xffffffff00000000);
        pcStack_258 = (char *)0x0;
        pbVar19 = pbVar17 + 1;
        bVar20 = pbVar17[1];
        if (bVar20 == 0) {
          std::__cxx11::string::append((char *)&local_2e8,(ulong)local_330);
          local_330 = pbVar19;
        }
        else if (bVar20 != 0x3c) {
          if (bVar20 == 0x7b) {
            pbVar19 = pbVar17 + 2;
          }
          else {
            iVar7 = strncmp((char *)pbVar19,"ENV{",4);
            if (iVar7 == 0) {
              pbVar19 = pbVar17 + 5;
              local_260 = (undefined1 *)CONCAT44(local_260._4_4_,1);
            }
            else {
              iVar7 = strncmp((char *)pbVar19,"CACHE{",6);
              if (iVar7 != 0) {
                bVar5 = cmsys::RegularExpression::find(local_1d8,(char *)pbVar19);
                if (bVar5) {
                  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_318,pbVar19,
                             pbVar19 + ((long)(local_2f8->cmNamedCurly).endp[0] -
                                       (long)(local_2f8->cmNamedCurly).searchstring));
                  plVar14 = (long *)std::__cxx11::string::replace
                                              ((ulong)&local_318,0,(char *)0x0,0x4c4275);
                  puVar15 = (ulong *)(plVar14 + 2);
                  if ((ulong *)*plVar14 == puVar15) {
                    local_2b0._16_8_ = *puVar15;
                    local_2b0._24_8_ = plVar14[3];
                    local_2b0._0_8_ = puVar1;
                  }
                  else {
                    local_2b0._16_8_ = *puVar15;
                    local_2b0._0_8_ = (ulong *)*plVar14;
                  }
                  local_2b0._8_8_ = plVar14[1];
                  *plVar14 = (long)puVar15;
                  plVar14[1] = 0;
                  *(undefined1 *)(plVar14 + 2) = 0;
                  plVar14 = (long *)std::__cxx11::string::append(local_2b0);
                  psVar16 = (size_type *)(plVar14 + 2);
                  if ((size_type *)*plVar14 == psVar16) {
                    local_1a8._16_8_ = *psVar16;
                    local_1a8._24_8_ = plVar14[3];
                    local_1a8._0_8_ = local_1a8 + 0x10;
                  }
                  else {
                    local_1a8._16_8_ = *psVar16;
                    local_1a8._0_8_ = (size_type *)*plVar14;
                  }
                  local_1a8._8_8_ = plVar14[1];
                  *plVar14 = (long)psVar16;
                  plVar14[1] = 0;
                  *(undefined1 *)(plVar14 + 2) = 0;
                  std::__cxx11::string::operator=((string *)local_320,(string *)local_1a8);
                  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
                    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
                  }
                  if ((ulong *)local_2b0._0_8_ != puVar1) {
                    operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
                  }
                  paVar12 = &local_318.field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_318._M_dataplus._M_p != paVar12) {
                    operator_delete(local_318._M_dataplus._M_p,
                                    local_318.field_2._M_allocated_capacity + 1);
                    paVar12 = extraout_RAX;
                  }
                  local_2f0 = FATAL_ERROR;
                  local_238 = CONCAT71((int7)((ulong)paVar12 >> 8),1);
                }
                goto LAB_0025314a;
              }
              pbVar19 = pbVar17 + 7;
              local_260 = (undefined1 *)CONCAT44(local_260._4_4_,2);
            }
          }
          std::__cxx11::string::append((char *)&local_2e8,(ulong)local_330);
          pcStack_258 = local_2e0;
          pbVar17 = pbVar19 + -1;
          local_330 = pbVar19;
          if (iStack_2c0._M_current == local_2b8) {
            std::vector<t_lookup,std::allocator<t_lookup>>::_M_realloc_insert<t_lookup_const&>
                      ((vector<t_lookup,std::allocator<t_lookup>> *)&local_2c8,iStack_2c0,
                       (t_lookup *)&local_260);
          }
          else {
            *(undefined1 **)iStack_2c0._M_current = local_260;
            (iStack_2c0._M_current)->loc = (size_t)local_2e0;
            iStack_2c0._M_current = iStack_2c0._M_current + 1;
          }
        }
      }
    }
    else if (bVar20 == 0x40) {
      if (replaceAt) {
        pbVar19 = pbVar17 + 1;
        pbVar9 = (byte *)strchr((char *)pbVar19,0x40);
        if ((pbVar9 != pbVar19 && pbVar9 != (byte *)0x0) &&
           (sVar10 = strspn((char *)pbVar19,
                            "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789/_.+-"),
           pbVar9 == pbVar19 + sVar10)) {
          local_1a8._0_8_ = local_1a8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,pbVar19,pbVar19 + ~(ulong)pbVar17 + (long)pbVar9);
          pcVar8 = GetDefinition(local_2f8,(string *)local_1a8);
          if (pcVar8 == (char *)0x0) {
            pcVar8 = "";
          }
          std::__cxx11::string::string((string *)local_2b0,pcVar8,(allocator *)&local_318);
          if ((char)local_264 != '\0') {
            cmSystemTools::EscapeQuotes(&local_318,(string *)local_2b0);
            std::__cxx11::string::operator=((string *)local_2b0,(string *)&local_318);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_318._M_dataplus._M_p != &local_318.field_2) {
              operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1
                             );
            }
          }
          std::__cxx11::string::append((char *)&local_2e8,(ulong)local_330);
          std::__cxx11::string::_M_append((char *)&local_2e8,local_2b0._0_8_);
          if ((ulong *)local_2b0._0_8_ != puVar1) {
            operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
          }
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          pbVar17 = pbVar9;
          local_330 = pbVar9 + 1;
          goto LAB_0025314a;
        }
      }
LAB_00253104:
      if (((local_2c8 != iStack_2c0._M_current) && (iVar7 = isalnum((int)(char)bVar20), iVar7 == 0))
         && ((uVar18 = bVar20 - 0x2b, 0x34 < uVar18 ||
             ((0x1000000000001dU >> ((ulong)uVar18 & 0x3f) & 1) == 0)))) {
        std::__cxx11::string::append((char *)local_320);
        std::__cxx11::string::push_back((char)local_320);
        std::__cxx11::string::append((char *)&local_2e8,(ulong)local_330);
        std::__cxx11::string::substr((ulong)&local_318,(ulong)&local_2e8);
        plVar14 = (long *)std::__cxx11::string::replace((ulong)&local_318,0,(char *)0x0,0x4c434a);
        puVar15 = (ulong *)(plVar14 + 2);
        if ((ulong *)*plVar14 == puVar15) {
          local_2b0._16_8_ = *puVar15;
          local_2b0._24_8_ = plVar14[3];
          local_2b0._0_8_ = puVar1;
        }
        else {
          local_2b0._16_8_ = *puVar15;
          local_2b0._0_8_ = (ulong *)*plVar14;
        }
        local_2b0._8_8_ = plVar14[1];
        *plVar14 = (long)puVar15;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::append(local_2b0);
        local_1a8._0_8_ = local_1a8 + 0x10;
        psVar16 = (size_type *)(plVar14 + 2);
        if ((size_type *)*plVar14 == psVar16) {
          local_1a8._16_8_ = *psVar16;
          local_1a8._24_8_ = plVar14[3];
        }
        else {
          local_1a8._16_8_ = *psVar16;
          local_1a8._0_8_ = (size_type *)*plVar14;
        }
        local_1a8._8_8_ = plVar14[1];
        *plVar14 = (long)psVar16;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_320,local_1a8._0_8_);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        if ((ulong *)local_2b0._0_8_ != puVar1) {
          operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
        }
        goto LAB_00253bc0;
      }
    }
    else if (bVar20 == 0x5c) {
LAB_00252f10:
      if ((char)local_20c != '\0') goto LAB_0025314a;
      bVar20 = pbVar17[1];
      if (bVar20 < 0x72) {
        if (bVar20 == 0x3b) {
          if (local_2c8 == iStack_2c0._M_current) goto LAB_002534d5;
        }
        else if (bVar20 == 0x6e) {
          std::__cxx11::string::append((char *)&local_2e8,(ulong)local_330);
          std::__cxx11::string::append((char *)&local_2e8);
          goto LAB_0025336d;
        }
LAB_0025330c:
        iVar7 = isalnum((int)(char)bVar20);
        if ((bVar20 == 0) || (iVar7 != 0)) {
          uVar11 = std::__cxx11::string::append((char *)local_320);
          if (bVar20 != 0) {
            uVar11 = std::__cxx11::string::push_back((char)local_320);
          }
          local_238 = CONCAT71((int7)((ulong)uVar11 >> 8),1);
          std::__cxx11::string::append((char *)local_320);
        }
        else {
          std::__cxx11::string::append((char *)&local_2e8,(ulong)local_330);
          local_330 = pbVar17 + 1;
        }
      }
      else {
        if (bVar20 == 0x72) {
          std::__cxx11::string::append((char *)&local_2e8,(ulong)local_330);
          std::__cxx11::string::append((char *)&local_2e8);
        }
        else {
          if (bVar20 != 0x74) goto LAB_0025330c;
          std::__cxx11::string::append((char *)&local_2e8,(ulong)local_330);
          std::__cxx11::string::append((char *)&local_2e8);
        }
LAB_0025336d:
        local_330 = pbVar17 + 2;
      }
LAB_002534d5:
      if (*local_330 != 0) {
        pbVar17 = pbVar17 + 1;
      }
    }
    else {
      if (bVar20 != 0x7d) goto LAB_00253104;
      if (local_2c8 == iStack_2c0._M_current) goto LAB_0025314a;
      tVar2 = iStack_2c0._M_current[-1].domain;
      uVar3 = iStack_2c0._M_current[-1].loc;
      iStack_2c0._M_current = iStack_2c0._M_current + -1;
      std::__cxx11::string::append((char *)&local_2e8,(ulong)local_330);
      std::__cxx11::string::substr((ulong)&local_318,(ulong)&local_2e8);
      local_260 = &local_250;
      pcStack_258 = (char *)0x0;
      local_250 = 0;
      if ((ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
           ::lineVar_abi_cxx11_ == '\0') &&
         (iVar7 = __cxa_guard_acquire(&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                                       ::lineVar_abi_cxx11_), iVar7 != 0)) {
        ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
        ::lineVar_abi_cxx11_._M_dataplus._M_p =
             (pointer)&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                       ::lineVar_abi_cxx11_.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)
                   &ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                    ::lineVar_abi_cxx11_,"CMAKE_CURRENT_LIST_LINE","");
        __cxa_atexit(std::__cxx11::string::~string,
                     &ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                      ::lineVar_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                             ::lineVar_abi_cxx11_);
      }
      if (tVar2 == NORMAL) {
        if (((filename == (char *)0x0) ||
            (local_318._M_string_length !=
             ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
             ::lineVar_abi_cxx11_._M_string_length)) ||
           ((local_318._M_string_length != 0 &&
            (iVar7 = bcmp(local_318._M_dataplus._M_p,
                          ExpandVariablesInStringNew(std::__cxx11::string&,std::__cxx11::string&,bool,bool,bool,char_const*,long,bool,bool)
                          ::lineVar_abi_cxx11_._M_dataplus._M_p,local_318._M_string_length),
            iVar7 != 0)))) {
          pcVar8 = GetDefinition(local_2f8,&local_318);
          goto LAB_00253247;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::ostream::_M_insert<long>((long)local_1a8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)&local_260,(string *)local_2b0);
        if ((ulong *)local_2b0._0_8_ != puVar1) {
          operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
LAB_00253580:
        if (((!removeEmpty) &&
            (local_2f8->GlobalGenerator->CMakeInstance->WarnUninitialized == true)) &&
           (bVar5 = cmState::Snapshot::IsInitialized(local_208,&local_318), !bVar5)) {
          if (local_2f8->CheckSystemVars == false) {
            std::__cxx11::string::string((string *)local_1a8,filename,(allocator *)&local_1c8);
            pcVar8 = cmake::GetHomeDirectory(local_2f8->GlobalGenerator->CMakeInstance);
            std::__cxx11::string::string((string *)local_2b0,pcVar8,&local_321);
            bVar5 = cmsys::SystemTools::IsSubDirectory((string *)local_1a8,(string *)local_2b0);
            bVar6 = true;
            if (!bVar5) {
              std::__cxx11::string::string((string *)&local_1f8,filename,&local_2e9);
              pcVar8 = cmake::GetHomeOutputDirectory(local_2f8->GlobalGenerator->CMakeInstance);
              std::__cxx11::string::string((string *)&local_230,pcVar8,&local_2ea);
              bVar6 = cmsys::SystemTools::IsSubDirectory(&local_1f8,&local_230);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_230._M_dataplus._M_p != &local_230.field_2) {
                operator_delete(local_230._M_dataplus._M_p,
                                local_230.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                operator_delete(local_1f8._M_dataplus._M_p,
                                local_1f8.field_2._M_allocated_capacity + 1);
              }
            }
            if ((ulong *)local_2b0._0_8_ != puVar1) {
              operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
            }
            if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            }
            if (bVar6 == false) goto LAB_0025391e;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          local_2b0._8_8_ = 0;
          local_2b0._16_8_ = local_2b0._16_8_ & 0xffffffffffffff00;
          local_290._M_p = (pointer)&local_280;
          local_288 = 0;
          local_280._M_local_buf[0] = '\0';
          local_270 = 0;
          local_2b0._0_8_ = puVar1;
          cmOutputConverter::cmOutputConverter((cmOutputConverter *)&local_1f8,*local_208);
          std::__cxx11::string::string((string *)&local_1c8,filename,&local_321);
          cmOutputConverter::Convert
                    (&local_230,(cmOutputConverter *)&local_1f8,&local_1c8,HOME,UNCHANGED);
          std::__cxx11::string::operator=((string *)&local_290,(string *)&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
          local_270 = local_240;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"uninitialized variable \'",0x18);
          poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,local_318._M_dataplus._M_p,
                               local_318._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\'",1);
          this_00 = local_2f8->GlobalGenerator->CMakeInstance;
          std::__cxx11::stringbuf::str();
          cmake::IssueMessage(this_00,AUTHOR_WARNING,&local_230,(cmListFileContext *)local_2b0,false
                             );
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
          }
          cmListFileContext::~cmListFileContext((cmListFileContext *)local_2b0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
        }
      }
      else {
        if (tVar2 == ENVIRONMENT) {
          pcVar8 = cmsys::SystemTools::GetEnv(local_318._M_dataplus._M_p);
        }
        else {
          if (tVar2 != CACHE) goto LAB_00253580;
          pcVar8 = cmState::GetCacheEntryValue(local_1d0,&local_318);
        }
LAB_00253247:
        pcVar4 = pcStack_258;
        if (pcVar8 == (char *)0x0) goto LAB_00253580;
        if ((char)local_264 == '\0') {
          strlen(pcVar8);
          std::__cxx11::string::_M_replace((ulong)&local_260,0,pcVar4,(ulong)pcVar8);
        }
        else {
          local_2b0._0_8_ = puVar1;
          sVar10 = strlen(pcVar8);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_2b0,pcVar8,pcVar8 + sVar10);
          cmSystemTools::EscapeQuotes((string *)local_1a8,(string *)local_2b0);
          std::__cxx11::string::operator=((string *)&local_260,(string *)local_1a8);
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
          }
          if ((ulong *)local_2b0._0_8_ != puVar1) {
            operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
          }
        }
      }
LAB_0025391e:
      std::__cxx11::string::replace((ulong)&local_2e8,uVar3,local_2e0 + -uVar3,(ulong)local_260);
      if (local_260 != &local_250) {
        operator_delete(local_260,CONCAT71(uStack_24f,local_250) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_dataplus._M_p != &local_318.field_2) {
        operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
      }
      local_330 = pbVar17 + 1;
    }
LAB_0025314a:
    if ((local_238 & 1) != 0) goto LAB_00253bc0;
    bVar20 = pbVar17[1];
    pbVar17 = pbVar17 + 1;
  } while (bVar20 != 0);
  if (local_2c8 == iStack_2c0._M_current) {
    std::__cxx11::string::append((char *)&local_2e8);
    std::__cxx11::string::_M_assign((string *)local_200);
  }
  else {
    std::__cxx11::string::append((char *)local_320);
LAB_00253bc0:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Syntax error in cmake code ",0x1b);
    if (filename != (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"at\n",3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
      sVar10 = strlen(filename);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,filename,sVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      poVar13 = std::ostream::_M_insert<long>((long)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"when parsing string\n",0x14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,(local_200->_M_dataplus)._M_p,
                         local_200->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(local_320->_M_dataplus)._M_p,local_320->_M_string_length);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)local_320,(string *)local_2b0);
    if ((ulong *)local_2b0._0_8_ != puVar1) {
      operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    local_2f0 = FATAL_ERROR;
  }
  if (local_2c8 != (t_lookup *)0x0) {
    operator_delete(local_2c8,(long)local_2b8 - (long)local_2c8);
  }
  if (local_2e8 != &local_2d8) {
    operator_delete(local_2e8,CONCAT71(uStack_2d7,local_2d8) + 1);
  }
  return local_2f0;
}

Assistant:

cmake::MessageType cmMakefile::ExpandVariablesInStringNew(
                                            std::string& errorstr,
                                            std::string& source,
                                            bool escapeQuotes,
                                            bool noEscapes,
                                            bool atOnly,
                                            const char* filename,
                                            long line,
                                            bool removeEmpty,
                                            bool replaceAt) const
{
  // This method replaces ${VAR} and @VAR@ where VAR is looked up
  // with GetDefinition(), if not found in the map, nothing is expanded.
  // It also supports the $ENV{VAR} syntax where VAR is looked up in
  // the current environment variables.

  const char* in = source.c_str();
  const char* last = in;
  std::string result;
  result.reserve(source.size());
  std::vector<t_lookup> openstack;
  bool error = false;
  bool done = false;
  cmake::MessageType mtype = cmake::LOG;

  cmState* state = this->GetCMakeInstance()->GetState();

  do
    {
    char inc = *in;
    switch(inc)
      {
      case '}':
        if(!openstack.empty())
          {
          t_lookup var = openstack.back();
          openstack.pop_back();
          result.append(last, in - last);
          std::string const& lookup = result.substr(var.loc);
          const char* value = NULL;
          std::string varresult;
          static const std::string lineVar = "CMAKE_CURRENT_LIST_LINE";
          switch(var.domain)
            {
            case NORMAL:
              if(filename && lookup == lineVar)
                {
                std::ostringstream ostr;
                ostr << line;
                varresult = ostr.str();
                }
              else
                {
                value = this->GetDefinition(lookup);
                }
              break;
            case ENVIRONMENT:
              value = cmSystemTools::GetEnv(lookup.c_str());
              break;
            case CACHE:
              value = state->GetCacheEntryValue(lookup);
              break;
            }
          // Get the string we're meant to append to.
          if(value)
            {
            if(escapeQuotes)
              {
              varresult = cmSystemTools::EscapeQuotes(value);
              }
            else
              {
              varresult = value;
              }
            }
          else if(!removeEmpty)
            {
            // check to see if we need to print a warning
            // if strict mode is on and the variable has
            // not been "cleared"/initialized with a set(foo ) call
            if(this->GetCMakeInstance()->GetWarnUninitialized() &&
               !this->VariableInitialized(lookup))
              {
              if (this->CheckSystemVars ||
                  cmSystemTools::IsSubDirectory(filename,
                                                this->GetHomeDirectory()) ||
                  cmSystemTools::IsSubDirectory(filename,
                                             this->GetHomeOutputDirectory()))
                {
                std::ostringstream msg;
                cmListFileContext lfc;
                cmOutputConverter converter(this->StateSnapshot);
                lfc.FilePath =
                    converter.Convert(filename, cmOutputConverter::HOME);
                lfc.Line = line;
                msg << "uninitialized variable \'" << lookup << "\'";
                this->GetCMakeInstance()->IssueMessage(cmake::AUTHOR_WARNING,
                                                       msg.str(), lfc);
                }
              }
            }
          result.replace(var.loc, result.size() - var.loc, varresult);
          // Start looking from here on out.
          last = in + 1;
          }
        break;
      case '$':
        if(!atOnly)
          {
          t_lookup lookup;
          const char* next = in + 1;
          const char* start = NULL;
          char nextc = *next;
          if(nextc == '{')
            {
            // Looking for a variable.
            start = in + 2;
            lookup.domain = NORMAL;
            }
          else if(nextc == '<')
            {
            }
          else if(!nextc)
            {
            result.append(last, next - last);
            last = next;
            }
          else if(cmHasLiteralPrefix(next, "ENV{"))
            {
            // Looking for an environment variable.
            start = in + 5;
            lookup.domain = ENVIRONMENT;
            }
          else if(cmHasLiteralPrefix(next, "CACHE{"))
            {
            // Looking for a cache variable.
            start = in + 7;
            lookup.domain = CACHE;
            }
          else
            {
            if(this->cmNamedCurly.find(next))
              {
              errorstr = "Syntax $"
                  + std::string(next, this->cmNamedCurly.end())
                  + "{} is not supported.  Only ${}, $ENV{}, "
                    "and $CACHE{} are allowed.";
              mtype = cmake::FATAL_ERROR;
              error = true;
              }
            }
          if(start)
            {
            result.append(last, in - last);
            last = start;
            in = start - 1;
            lookup.loc = result.size();
            openstack.push_back(lookup);
            }
          break;
          }
      case '\\':
        if(!noEscapes)
          {
          const char* next = in + 1;
          char nextc = *next;
          if(nextc == 't')
            {
            result.append(last, in - last);
            result.append("\t");
            last = next + 1;
            }
          else if(nextc == 'n')
            {
            result.append(last, in - last);
            result.append("\n");
            last = next + 1;
            }
          else if(nextc == 'r')
            {
            result.append(last, in - last);
            result.append("\r");
            last = next + 1;
            }
          else if(nextc == ';' && openstack.empty())
            {
            // Handled in ExpandListArgument; pass the backslash literally.
            }
          else if (isalnum(nextc) || nextc == '\0')
            {
            errorstr += "Invalid character escape '\\";
            if (nextc)
              {
              errorstr += nextc;
              errorstr += "'.";
              }
            else
              {
              errorstr += "' (at end of input).";
              }
            error = true;
            }
          else
            {
            // Take what we've found so far, skipping the escape character.
            result.append(last, in - last);
            // Start tracking from the next character.
            last = in + 1;
            }
          // Skip the next character since it was escaped, but don't read past
          // the end of the string.
          if(*last)
            {
            ++in;
            }
          }
        break;
      case '\n':
        // Onto the next line.
        ++line;
        break;
      case '\0':
        done = true;
        break;
      case '@':
        if(replaceAt)
          {
          const char* nextAt = strchr(in + 1, '@');
          if(nextAt && nextAt != in + 1 &&
             nextAt == in + 1 + strspn(in + 1,
                "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
                "abcdefghijklmnopqrstuvwxyz"
                "0123456789/_.+-"))
            {
            std::string variable(in + 1, nextAt - in - 1);
            std::string varresult = this->GetSafeDefinition(variable);
            if(escapeQuotes)
              {
              varresult = cmSystemTools::EscapeQuotes(varresult);
              }
            // Skip over the variable.
            result.append(last, in - last);
            result.append(varresult);
            in = nextAt;
            last = in + 1;
            break;
            }
          }
        // Failed to find a valid @ expansion; treat it as literal.
        /* FALLTHROUGH */
      default:
        {
        if(!openstack.empty() &&
           !(isalnum(inc) || inc == '_' ||
             inc == '/' || inc == '.' ||
             inc == '+' || inc == '-'))
          {
          errorstr += "Invalid character (\'";
          errorstr += inc;
          result.append(last, in - last);
          errorstr += "\') in a variable name: "
                      "'" + result.substr(openstack.back().loc) + "'";
          mtype = cmake::FATAL_ERROR;
          error = true;
          }
        break;
        }
      }
    // Look at the next character.
    } while(!error && !done && *++in);

  // Check for open variable references yet.
  if(!error && !openstack.empty())
    {
    // There's an open variable reference waiting.  Policy CMP0010 flags
    // whether this is an error or not.  The new parser now enforces
    // CMP0010 as well.
    errorstr += "There is an unterminated variable reference.";
    error = true;
    }

  if(error)
    {
    std::ostringstream emsg;
    emsg << "Syntax error in cmake code ";
    if(filename)
      {
      // This filename and line number may be more specific than the
      // command context because one command invocation can have
      // arguments on multiple lines.
      emsg << "at\n"
            << "  " << filename << ":" << line << "\n";
      }
    emsg << "when parsing string\n"
         << "  " << source << "\n";
    emsg << errorstr;
    mtype = cmake::FATAL_ERROR;
    errorstr = emsg.str();
    }
  else
    {
    // Append the rest of the unchanged part of the string.
    result.append(last);

    source = result;
    }

  return mtype;
}